

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingExtension
          (DescriptorPoolDatabase *this,StringViewArg containing_type,int field_number,
          FileDescriptorProto *output)

{
  DescriptorPool *this_00;
  string_view name;
  Descriptor *extendee_00;
  FieldDescriptor *this_01;
  FileDescriptor *pFVar1;
  FieldDescriptor *extension;
  Descriptor *extendee;
  FileDescriptorProto *output_local;
  int field_number_local;
  StringViewArg containing_type_local;
  DescriptorPoolDatabase *this_local;
  
  this_00 = this->pool_;
  name = (string_view)
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)containing_type);
  extendee_00 = DescriptorPool::FindMessageTypeByName(this_00,name);
  if (extendee_00 == (Descriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_01 = DescriptorPool::FindExtensionByNumber(this->pool_,extendee_00,field_number);
    if (this_01 == (FieldDescriptor *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      FileDescriptorProto::Clear(output);
      pFVar1 = FieldDescriptor::file(this_01);
      FileDescriptor::CopyTo(pFVar1,output);
      if (((this->options_).preserve_source_code_info & 1U) != 0) {
        pFVar1 = FieldDescriptor::file(this_01);
        FileDescriptor::CopySourceCodeInfoTo(pFVar1,output);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingExtension(
    StringViewArg containing_type, int field_number,
    FileDescriptorProto* PROTOBUF_NONNULL output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(containing_type);
  if (extendee == nullptr) return false;

  const FieldDescriptor* extension =
      pool_.FindExtensionByNumber(extendee, field_number);
  if (extension == nullptr) return false;

  output->Clear();
  extension->file()->CopyTo(output);
  if (options_.preserve_source_code_info) {
    extension->file()->CopySourceCodeInfoTo(output);
  }
  return true;
}